

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int write_crypto_data(quicly_conn_t *conn,ptls_buffer_t *tlsbuf,size_t *epoch_offsets)

{
  int iVar1;
  quicly_conn_t *conn_00;
  long in_RDX;
  long in_RSI;
  quicly_stream_t *stream;
  size_t len;
  int ret;
  size_t epoch;
  quicly_stream_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ulong local_28;
  
  if (*(long *)(in_RSI + 0x10) != 0) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      conn_00 = (quicly_conn_t *)
                (*(long *)(in_RDX + 8 + local_28 * 8) - *(long *)(in_RDX + local_28 * 8));
      if (conn_00 != (quicly_conn_t *)0x0) {
        in_stack_ffffffffffffffc0 =
             quicly_get_stream(conn_00,(quicly_stream_id_t)in_stack_ffffffffffffffc0);
        if (in_stack_ffffffffffffffc0 == (quicly_stream_t *)0x0) {
          __assert_fail("stream != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x3ae,"int write_crypto_data(quicly_conn_t *, ptls_buffer_t *, size_t *)");
        }
        iVar1 = quicly_streambuf_egress_write
                          ((quicly_stream_t *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),conn_00,
                           (size_t)in_stack_ffffffffffffffc0);
        if (iVar1 != 0) {
          return iVar1;
        }
        in_stack_ffffffffffffffd4 = 0;
      }
    }
  }
  return 0;
}

Assistant:

static int write_crypto_data(quicly_conn_t *conn, ptls_buffer_t *tlsbuf, size_t epoch_offsets[5])
{
    size_t epoch;
    int ret;

    if (tlsbuf->off == 0)
        return 0;

    for (epoch = 0; epoch < 4; ++epoch) {
        size_t len = epoch_offsets[epoch + 1] - epoch_offsets[epoch];
        if (len == 0)
            continue;
        quicly_stream_t *stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + epoch));
        assert(stream != NULL);
        if ((ret = quicly_streambuf_egress_write(stream, tlsbuf->base + epoch_offsets[epoch], len)) != 0)
            return ret;
    }

    return 0;
}